

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ArrayFeatureType::SerializeWithCachedSizes
          (ArrayFeatureType *this,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  ulong *puVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  ulong value;
  ulong uVar9;
  int index;
  uint value_00;
  
  if (0 < (this->shape_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
      iVar3 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      iVar3 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar3;
    }
    value_00 = this->_shape_cached_byte_size_;
    if (iVar3 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar7 = pbVar1;
      uVar8 = value_00;
      if (0x7f < value_00) {
        do {
          *pbVar7 = (byte)value_00 | 0x80;
          uVar8 = value_00 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar2 = 0x3fff < value_00;
          value_00 = uVar8;
        } while (bVar2);
      }
      *pbVar7 = (byte)uVar8;
      iVar3 = ((int)pbVar7 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar3;
      output->buffer_size_ = output->buffer_size_ - iVar3;
    }
    iVar3 = (this->shape_).current_size_;
    if (0 < iVar3) {
      index = 0;
      do {
        puVar5 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->shape_,index);
        value = *puVar5;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value);
        }
        else {
          pbVar1 = output->buffer_;
          pbVar7 = pbVar1;
          uVar9 = value;
          if (0x7f < value) {
            do {
              *pbVar7 = (byte)value | 0x80;
              uVar9 = value >> 7;
              pbVar7 = pbVar7 + 1;
              bVar2 = 0x3fff < value;
              value = uVar9;
            } while (bVar2);
          }
          *pbVar7 = (byte)uVar9;
          iVar6 = ((int)pbVar7 - (int)pbVar1) + 1;
          output->buffer_ = output->buffer_ + iVar6;
          output->buffer_size_ = output->buffer_size_ - iVar6;
        }
        index = index + 1;
      } while (index != iVar3);
    }
  }
  if (this->datatype_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(2,this->datatype_,output);
  }
  uVar4 = this->_oneof_case_[0];
  if (uVar4 == 0x15) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x15,&((this->ShapeFlexibility_).enumeratedshapes_)->super_MessageLite,output);
    uVar4 = this->_oneof_case_[0];
  }
  if (uVar4 == 0x1f) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&((this->ShapeFlexibility_).enumeratedshapes_)->super_MessageLite,output);
  }
  uVar4 = this->_oneof_case_[1];
  if (uVar4 == 0x29) {
    google::protobuf::internal::WireFormatLite::WriteInt32
              (0x29,(this->defaultOptionalValue_).intdefaultvalue_,output);
    uVar4 = this->_oneof_case_[1];
  }
  if (uVar4 == 0x33) {
    google::protobuf::internal::WireFormatLite::WriteFloat
              (0x33,(this->defaultOptionalValue_).floatdefaultvalue_,output);
    uVar4 = this->_oneof_case_[1];
  }
  if (uVar4 != 0x3d) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteDouble
            (0x3d,(this->defaultOptionalValue_).doubledefaultvalue_,output);
  return;
}

Assistant:

void ArrayFeatureType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ArrayFeatureType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 shape = 1;
  if (this->shape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_shape_cached_byte_size_);
  }
  for (int i = 0, n = this->shape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->shape(i), output);
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->datatype() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      2, this->datatype(), output);
  }

  // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
  if (has_enumeratedshapes()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      21, *ShapeFlexibility_.enumeratedshapes_, output);
  }

  // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
  if (has_shaperange()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *ShapeFlexibility_.shaperange_, output);
  }

  // int32 intDefaultValue = 41;
  if (has_intdefaultvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(41, this->intdefaultvalue(), output);
  }

  // float floatDefaultValue = 51;
  if (has_floatdefaultvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(51, this->floatdefaultvalue(), output);
  }

  // double doubleDefaultValue = 61;
  if (has_doubledefaultvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(61, this->doubledefaultvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ArrayFeatureType)
}